

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O2

MTBDD mtbdd_makeleaf(uint32_t type,uint64_t value)

{
  FILE *__stream;
  int iVar1;
  MTBDD MVar2;
  size_t sVar3;
  ulong a;
  int created;
  
  a = (ulong)type | 0x4000000000000000;
  iVar1 = sylvan_mt_has_custom_hash(type);
  if (iVar1 == 0) {
    MVar2 = llmsset_lookup(nodes,a,value,&created);
  }
  else {
    MVar2 = llmsset_lookupc(nodes,a,value,&created);
  }
  if (MVar2 == 0) {
    sylvan_gc_RUN();
    if (iVar1 == 0) {
      MVar2 = llmsset_lookup(nodes,a,value,&created);
    }
    else {
      MVar2 = llmsset_lookupc(nodes,a,value,&created);
    }
    __stream = _stderr;
    if (MVar2 == 0) {
      sVar3 = llmsset_count_marked_RUN(nodes);
      fprintf(__stream,"BDD Unique table full, %zu of %zu buckets filled!\n",sVar3,nodes->table_size
             );
      exit(1);
    }
  }
  return MVar2;
}

Assistant:

MTBDD
mtbdd_makeleaf(uint32_t type, uint64_t value)
{
    struct mtbddnode n;
    mtbddnode_makeleaf(&n, type, value);

    int custom = sylvan_mt_has_custom_hash(type);

    int created;
    uint64_t index = custom ? llmsset_lookupc(nodes, n.a, n.b, &created) : llmsset_lookup(nodes, n.a, n.b, &created);
    if (index == 0) {
        RUN(sylvan_gc);

        index = custom ? llmsset_lookupc(nodes, n.a, n.b, &created) : llmsset_lookup(nodes, n.a, n.b, &created);
        if (index == 0) {
            fprintf(stderr, "BDD Unique table full, %zu of %zu buckets filled!\n", llmsset_count_marked(nodes), llmsset_get_size(nodes));
            exit(1);
        }
    }

    if (created) sylvan_stats_count(BDD_NODES_CREATED);
    else sylvan_stats_count(BDD_NODES_REUSED);

    return (MTBDD)index;
}